

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O1

int dasm_checkstep(BuildCtx *ctx,int secmatch)

{
  dasm_State *pdVar1;
  int *piVar2;
  long lVar3;
  
  pdVar1 = ctx->D;
  if (pdVar1->status == 0) {
    piVar2 = pdVar1->lglabels;
    lVar3 = 1;
    do {
      if (0 < piVar2[lVar3]) {
        pdVar1->status = (int)lVar3 + 0x21000000;
        break;
      }
      piVar2[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
  }
  if (((-1 < secmatch) && (pdVar1->status == 0)) &&
     (pdVar1->section != pdVar1->sections + (uint)secmatch)) {
    pdVar1->status =
         (int)((ulong)((long)pdVar1->section - (long)pdVar1->sections) >> 3) * -0x33333333 |
         0x3000000;
  }
  return pdVar1->status;
}

Assistant:

int dasm_checkstep(Dst_DECL, int secmatch)
{
  dasm_State *D = Dst_REF;
  if (D->status == DASM_S_OK) {
    int i;
    for (i = 1; i <= 9; i++) {
      if (D->lglabels[i] > 0) { D->status = DASM_S_UNDEF_L|i; break; }
      D->lglabels[i] = 0;
    }
  }
  if (D->status == DASM_S_OK && secmatch >= 0 &&
      D->section != &D->sections[secmatch])
    D->status = DASM_S_MATCH_SEC|(int)(D->section-D->sections);
  return D->status;
}